

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedConeShape.cpp
# Opt level: O2

void __thiscall
chrono::ChRoundedConeShape::ArchiveOUT(ChRoundedConeShape *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::geometry::ChRoundedCone> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChRoundedConeShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->groundedcone;
  local_28._name = "groundedcone";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChRoundedConeShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChRoundedConeShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(groundedcone);
}